

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::PipelineStateVkImpl::~PipelineStateVkImpl(PipelineStateVkImpl *this)

{
  void *in_RSI;
  PipelineStateVkImpl *this_local;
  
  ~PipelineStateVkImpl(this);
  RefCountedObject<Diligent::IPipelineStateVk>::operator_delete
            ((RefCountedObject<Diligent::IPipelineStateVk> *)this,in_RSI);
  return;
}

Assistant:

PipelineStateVkImpl::~PipelineStateVkImpl()
{
    // Make sure that asynchrous task is complete as it references the pipeline object.
    // This needs to be done in the final class before the destruction begins.
    GetStatus(/*WaitForCompletion =*/true);

    Destruct();
}